

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

uint8_t peek_u8(uchar **cursor,size_t *max)

{
  uint8_t uVar1;
  uint8_t v;
  size_t *max_local;
  uchar **cursor_local;
  
  uVar1 = pull_u8(cursor,max);
  if (*cursor != (uchar *)0x0) {
    *cursor = *cursor + -1;
    *max = *max + 1;
  }
  return uVar1;
}

Assistant:

uint8_t peek_u8(const unsigned char **cursor, size_t *max)
{
    uint8_t v = pull_u8(cursor, max);
    if (*cursor) {
        *cursor -= sizeof(v);
        *max += sizeof(v);
    }
    return v;
}